

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O1

String * __thiscall
Rml::EventDispatcher::ToString_abi_cxx11_(String *__return_storage_ptr__,EventDispatcher *this)

{
  pointer pEVar1;
  EventId id;
  EventSpecification *pEVar2;
  int iVar3;
  ulong uVar4;
  const_iterator __begin1;
  pointer pEVar5;
  const_iterator __end1;
  String local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pEVar5 = (this->listeners).
           super__Vector_base<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->listeners).
           super__Vector_base<Rml::EventListenerEntry,_std::allocator<Rml::EventListenerEntry>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar5 != pEVar1) {
    id = pEVar5->id;
    uVar4 = 0;
    do {
      if (pEVar5->id == id) {
        iVar3 = (int)uVar4;
      }
      else {
        pEVar2 = EventSpecificationInterface::Get(id);
        CreateString_abi_cxx11_(&local_58,"%s (%d), ",(pEVar2->type)._M_dataplus._M_p);
        ::std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        id = pEVar5->id;
        iVar3 = 0;
      }
      uVar4 = (ulong)(iVar3 + 1);
      pEVar5 = pEVar5 + 1;
    } while (pEVar5 != pEVar1);
    if (-1 < iVar3) {
      pEVar2 = EventSpecificationInterface::Get(id);
      CreateString_abi_cxx11_(&local_58,"%s (%d), ",(pEVar2->type)._M_dataplus._M_p,uVar4);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_58._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    if (2 < __return_storage_ptr__->_M_string_length) {
      ::std::__cxx11::string::resize
                ((ulong)__return_storage_ptr__,(char)__return_storage_ptr__->_M_string_length + -2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String EventDispatcher::ToString() const
{
	String result;

	if (listeners.empty())
		return result;

	auto add_to_result = [&result](EventId id, int count) {
		const EventSpecification& specification = EventSpecificationInterface::Get(id);
		result += CreateString("%s (%d), ", specification.type.c_str(), count);
	};

	EventId previous_id = listeners[0].id;
	int count = 0;
	for (const auto& listener : listeners)
	{
		if (listener.id != previous_id)
		{
			add_to_result(previous_id, count);
			previous_id = listener.id;
			count = 0;
		}
		count++;
	}

	if (count > 0)
		add_to_result(previous_id, count);

	if (result.size() > 2)
		result.resize(result.size() - 2);

	return result;
}